

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

ELEMENT_TYPE * getElementType(XML_Parser parser,ENCODING *enc,char *ptr,char *end)

{
  DTD *pDVar1;
  int iVar2;
  XML_Char *name_00;
  ELEMENT_TYPE *ret;
  XML_Char *name;
  DTD *dtd;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  pDVar1 = parser->m_dtd;
  name_00 = poolStoreString(&pDVar1->pool,enc,ptr,end);
  if (name_00 == (XML_Char *)0x0) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    parser_local = (XML_Parser)lookup(parser,&pDVar1->elementTypes,name_00,0x28);
    if (parser_local == (XML_Parser)0x0) {
      parser_local = (XML_Parser)0x0;
    }
    else if ((XML_Char *)parser_local->m_userData == name_00) {
      (pDVar1->pool).start = (pDVar1->pool).ptr;
      iVar2 = setElementTypePrefix(parser,(ELEMENT_TYPE *)parser_local);
      if (iVar2 == 0) {
        parser_local = (XML_Parser)0x0;
      }
    }
    else {
      (pDVar1->pool).ptr = (pDVar1->pool).start;
    }
  }
  return (ELEMENT_TYPE *)parser_local;
}

Assistant:

static ELEMENT_TYPE *
getElementType(XML_Parser parser,
               const ENCODING *enc,
               const char *ptr,
               const char *end)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  const XML_Char *name = poolStoreString(&dtd->pool, enc, ptr, end);
  ELEMENT_TYPE *ret;

  if (!name)
    return NULL;
  ret = (ELEMENT_TYPE *) lookup(parser, &dtd->elementTypes, name, sizeof(ELEMENT_TYPE));
  if (!ret)
    return NULL;
  if (ret->name != name)
    poolDiscard(&dtd->pool);
  else {
    poolFinish(&dtd->pool);
    if (!setElementTypePrefix(parser, ret))
      return NULL;
  }
  return ret;
}